

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# value_parser.cc
# Opt level: O1

void __thiscall iqxmlrpc::ValueBuilder::do_visit_text(ValueBuilder *this,string *text)

{
  pointer pcVar1;
  Date_time *pDVar2;
  Binary_data *pBVar3;
  bool bVar4;
  Date_time *this_00;
  Binary_data *pBVar5;
  XML_RPC_violation *this_01;
  i_interpreter_type i_interpreter;
  double local_58;
  string local_50;
  lexical_ostream_limited_src<char,_std::char_traits<char>_> local_30;
  
  switch((this->state_).curr_) {
  case 0:
    (this->super_ValueBuilderBase).super_BuilderBase.want_exit_ = true;
  case 1:
    this_00 = (Date_time *)operator_new(0x28);
    (this_00->super_Value_type)._vptr_Value_type = (_func_int **)&PTR__Scalar_0018bcb8;
    *(int **)&this_00->tm_ = &(this_00->tm_).tm_mon;
    pcVar1 = (text->_M_dataplus)._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&this_00->tm_,pcVar1,pcVar1 + text->_M_string_length);
    break;
  case 2:
    this_00 = (Date_time *)operator_new(0x10);
    local_58 = (double)((ulong)local_58 & 0xffffffff00000000);
    local_50._M_string_length = (size_type)(text->_M_dataplus)._M_p;
    local_50.field_2._M_allocated_capacity = local_50._M_string_length + text->_M_string_length;
    local_30.start = (char *)local_50._M_string_length;
    local_30.finish = (char *)local_50.field_2._M_allocated_capacity;
    bVar4 = boost::detail::lexical_ostream_limited_src<char,_std::char_traits<char>_>::
            shr_signed<int>(&local_30,(int *)&local_58);
    if (!bVar4) {
      local_50._M_dataplus._M_p = (pointer)&PTR__bad_cast_0018a1e0;
      local_50._M_string_length = (size_type)&std::__cxx11::string::typeinfo;
      local_50.field_2._M_allocated_capacity = (size_type)&int::typeinfo;
      boost::throw_exception<boost::bad_lexical_cast>((bad_lexical_cast *)&local_50);
    }
    (this_00->super_Value_type)._vptr_Value_type = (_func_int **)&PTR__Value_type_0018bb78;
    (this_00->tm_).tm_sec = local_58._0_4_;
    break;
  case 3:
    this_00 = (Date_time *)operator_new(0x10);
    local_58 = 0.0;
    local_50._M_string_length = (size_type)(text->_M_dataplus)._M_p;
    local_50.field_2._M_allocated_capacity = local_50._M_string_length + text->_M_string_length;
    local_30.start = (char *)local_50._M_string_length;
    local_30.finish = (char *)local_50.field_2._M_allocated_capacity;
    bVar4 = boost::detail::lexical_ostream_limited_src<char,_std::char_traits<char>_>::
            shr_signed<long>(&local_30,(long *)&local_58);
    if (!bVar4) {
      local_50._M_dataplus._M_p = (pointer)&PTR__bad_cast_0018a1e0;
      local_50._M_string_length = (size_type)&std::__cxx11::string::typeinfo;
      local_50.field_2._M_allocated_capacity = (size_type)&long::typeinfo;
      boost::throw_exception<boost::bad_lexical_cast>((bad_lexical_cast *)&local_50);
    }
    (this_00->super_Value_type)._vptr_Value_type = (_func_int **)&PTR__Value_type_0018bbc8;
    *(double *)&this_00->tm_ = local_58;
    break;
  case 4:
    this_00 = (Date_time *)operator_new(0x10);
    local_58 = (double)((ulong)local_58 & 0xffffffff00000000);
    local_50._M_string_length = (size_type)(text->_M_dataplus)._M_p;
    local_50.field_2._M_allocated_capacity = local_50._M_string_length + text->_M_string_length;
    local_30.start = (char *)local_50._M_string_length;
    local_30.finish = (char *)local_50.field_2._M_allocated_capacity;
    bVar4 = boost::detail::lexical_ostream_limited_src<char,_std::char_traits<char>_>::
            shr_signed<int>(&local_30,(int *)&local_58);
    if (!bVar4) {
      local_50._M_dataplus._M_p = (pointer)&PTR__bad_cast_0018a1e0;
      local_50._M_string_length = (size_type)&std::__cxx11::string::typeinfo;
      local_50.field_2._M_allocated_capacity = (size_type)&int::typeinfo;
      boost::throw_exception<boost::bad_lexical_cast>((bad_lexical_cast *)&local_50);
    }
    (this_00->super_Value_type)._vptr_Value_type = (_func_int **)&PTR__Value_type_0018bc18;
    *(bool *)&(this_00->tm_).tm_sec = local_58._0_4_ != 0;
    break;
  case 5:
    this_00 = (Date_time *)operator_new(0x10);
    local_58 = 0.0;
    local_50._M_string_length = (size_type)(text->_M_dataplus)._M_p;
    local_50.field_2._M_allocated_capacity = local_50._M_string_length + text->_M_string_length;
    local_30.start = (char *)local_50._M_string_length;
    local_30.finish = (char *)local_50.field_2._M_allocated_capacity;
    bVar4 = boost::detail::lexical_ostream_limited_src<char,_std::char_traits<char>_>::
            float_types_converter_internal<double>(&local_30,&local_58);
    if (!bVar4) {
      local_50._M_dataplus._M_p = (pointer)&PTR__bad_cast_0018a1e0;
      local_50._M_string_length = (size_type)&std::__cxx11::string::typeinfo;
      local_50.field_2._M_allocated_capacity = (size_type)&double::typeinfo;
      boost::throw_exception<boost::bad_lexical_cast>((bad_lexical_cast *)&local_50);
    }
    (this_00->super_Value_type)._vptr_Value_type = (_func_int **)&PTR__Value_type_0018bc68;
    *(double *)&this_00->tm_ = local_58;
    break;
  case 6:
    pBVar5 = Binary_data::from_base64(text);
    pBVar3 = (Binary_data *)(this->super_ValueBuilderBase).retval._M_ptr;
    if (pBVar3 == pBVar5) {
      return;
    }
    if (pBVar3 != (Binary_data *)0x0) {
      (*(pBVar3->super_Value_type)._vptr_Value_type[1])();
    }
    (this->super_ValueBuilderBase).retval._M_ptr = &pBVar5->super_Value_type;
    return;
  case 7:
    this_00 = (Date_time *)operator_new(0x60);
    Date_time::Date_time(this_00,text);
    break;
  default:
    this_01 = (XML_RPC_violation *)__cxa_allocate_exception(0x18);
    Parser::context_abi_cxx11_(&local_50,(this->super_ValueBuilderBase).super_BuilderBase.parser_);
    XML_RPC_violation::XML_RPC_violation(this_01,&local_50);
    __cxa_throw(this_01,&XML_RPC_violation::typeinfo,std::runtime_error::~runtime_error);
  }
  pDVar2 = (Date_time *)(this->super_ValueBuilderBase).retval._M_ptr;
  if (pDVar2 != this_00) {
    if (pDVar2 != (Date_time *)0x0) {
      (*(pDVar2->super_Value_type)._vptr_Value_type[1])();
    }
    (this->super_ValueBuilderBase).retval._M_ptr = &this_00->super_Value_type;
  }
  return;
}

Assistant:

void
ValueBuilder::do_visit_text(const std::string& text)
{
  using boost::lexical_cast;

  switch (state_.get_state()) {
  case VALUE:
    want_exit();
  case STRING:
    retval.reset(new String(text));
    break;

  case INT:
    retval.reset(new Int(lexical_cast<int>(text)));
    break;

  case INT64:
    retval.reset(new Int64(lexical_cast<int64_t>(text)));
    break;

  case BOOL:
    retval.reset(new Bool(lexical_cast<int>(text) != 0));
    break;

  case DOUBLE:
    retval.reset(new Double(lexical_cast<double>(text)));
    break;

  case BINARY:
    retval.reset(Binary_data::from_base64(text));
    break;

  case TIME:
    retval.reset(new Date_time(text));
    break;

  default:
    throw XML_RPC_violation(parser_.context());
  }
}